

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::session_impl::log_portmap
          (session_impl *this,portmap_transport transport,char *msg,listen_socket_handle *ls)

{
  listen_socket_t *plVar1;
  bool bVar2;
  portmap_transport local_39;
  address local_38;
  char *local_10;
  
  local_39 = transport;
  local_10 = msg;
  plVar1 = listen_socket_handle::get(ls);
  if (((this->m_alerts).m_alert_mask._M_i.m_val >> 0x13 & 1) != 0) {
    if (plVar1 == (listen_socket_t *)0x0) {
      local_38.ipv6_address_.addr_.__in6_u._8_8_ = 0;
      local_38.ipv6_address_.scope_id_ = 0;
      local_38.type_ = ipv4;
      local_38.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
      local_38.ipv6_address_.addr_.__in6_u._0_8_ = 0;
    }
    else {
      bVar2 = (plVar1->local_endpoint).impl_.data_.base.sa_family != 2;
      if (bVar2) {
        local_38.ipv6_address_.addr_.__in6_u._0_8_ =
             *(undefined8 *)((long)&(plVar1->local_endpoint).impl_.data_ + 8);
        local_38.ipv6_address_.addr_.__in6_u._8_8_ =
             *(undefined8 *)((long)&(plVar1->local_endpoint).impl_.data_ + 0x10);
        local_38.ipv6_address_.scope_id_ =
             (unsigned_long)(plVar1->local_endpoint).impl_.data_.v6.sin6_scope_id;
        local_38.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
      }
      else {
        local_38.ipv4_address_.addr_.s_addr =
             (in4_addr_type)(plVar1->local_endpoint).impl_.data_.v6.sin6_flowinfo;
        local_38.ipv6_address_.addr_.__in6_u._0_8_ = 0;
        local_38.ipv6_address_.addr_.__in6_u._8_8_ = 0;
        local_38.ipv6_address_.scope_id_ = 0;
      }
      local_38.type_ = (uint)bVar2;
    }
    alert_manager::
    emplace_alert<libtorrent::portmap_log_alert,libtorrent::portmap_transport&,char_const*&,boost::asio::ip::address>
              (&this->m_alerts,&local_39,&local_10,&local_38);
  }
  return;
}

Assistant:

void session_impl::log_portmap(portmap_transport transport, char const* msg
		, listen_socket_handle const& ls) const
	{
		listen_socket_t const* listen_socket = ls.get();
		if (m_alerts.should_post<portmap_log_alert>())
			m_alerts.emplace_alert<portmap_log_alert>(transport, msg
				, listen_socket ? listen_socket->local_endpoint.address() : address());
	}